

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O0

bool __thiscall
OIS::LinuxInputManager::vendorExist(LinuxInputManager *this,Type iType,string *vendor)

{
  __type _Var1;
  bool bVar2;
  iterator __lhs;
  int in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator i;
  __normal_iterator<OIS::JoyStickInfo_*,_std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>_>
  local_28 [2];
  undefined4 in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool local_1;
  
  pbVar3 = in_RDI;
  if (((in_ESI == 1) || (in_ESI == 2)) &&
     (_Var1 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)), _Var1)) {
    local_1 = *(long *)(in_RDI + 200) != 0;
  }
  else {
    if (in_ESI == 3) {
      local_28[0]._M_current =
           (JoyStickInfo *)
           std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>::begin
                     ((vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_> *)in_RDI);
      while( true ) {
        __lhs = std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>::end
                          ((vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_> *)in_RDI);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<OIS::JoyStickInfo_*,_std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>_>
                            *)__lhs._M_current,
                           (__normal_iterator<OIS::JoyStickInfo_*,_std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>_>
                            *)in_RDI);
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<OIS::JoyStickInfo_*,_std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>_>
        ::operator->(local_28);
        _Var1 = std::operator==(pbVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        if (_Var1) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<OIS::JoyStickInfo_*,_std::vector<OIS::JoyStickInfo,_std::allocator<OIS::JoyStickInfo>_>_>
        ::operator++(local_28);
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LinuxInputManager::vendorExist(Type iType, const std::string& vendor)
{
	if((iType == OISKeyboard || iType == OISMouse) && vendor == mInputSystemName)
	{
		return window ? true : false;
	}
	else if(iType == OISJoyStick)
	{
		for(JoyStickInfoList::iterator i = unusedJoyStickList.begin(); i != unusedJoyStickList.end(); ++i)
			if(i->vendor == vendor)
				return true;
	}

	return false;
}